

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O1

void __thiscall
cm::uv_handle_deleter<uv_async_s>::operator()
          (uv_handle_deleter<uv_async_s> *this,uv_async_t *handle)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)
            (this->handleMutex).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if (handle != (uv_async_t *)0x0) {
      iVar1 = uv_is_closing((uv_handle_t *)handle);
      if (iVar1 != 0) goto LAB_0011ebe8;
      iVar1 = uv_is_closing((uv_handle_t *)handle);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)handle,
                 handle_default_delete<uv_async_s>::anon_class_1_0_00000001::__invoke);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
LAB_0011ebe8:
  __assert_fail("!uv_is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmUVHandlePtr.cxx"
                ,0x4b,"void cm::handle_default_delete(T *) [T = uv_async_s]");
}

Assistant:

void operator()(uv_async_t* handle)
  {
    std::lock_guard<std::mutex> lock(*this->handleMutex);
    handle_default_delete(handle);
  }